

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::CalculateNumTiles
               (vector<int,_std::allocator<int>_> *numTiles,int toplevel_size,int size,
               int tile_rounding_mode)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  uint local_28;
  int l;
  uint i;
  int tile_rounding_mode_local;
  int size_local;
  int toplevel_size_local;
  vector<int,_std::allocator<int>_> *numTiles_local;
  
  local_28 = 0;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(numTiles);
    if (sVar3 <= local_28) {
      return true;
    }
    iVar1 = LevelSize(toplevel_size,local_28,tile_rounding_mode);
    if (iVar1 < 0) break;
    iVar2 = std::numeric_limits<int>::max();
    if ((iVar2 - size) + 1 < iVar1) {
      return false;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](numTiles,(ulong)local_28);
    *pvVar4 = (iVar1 + size + -1) / size;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

static bool CalculateNumTiles(std::vector<int>& numTiles,
  int toplevel_size,
  int size,
  int tile_rounding_mode) {
  for (unsigned i = 0; i < numTiles.size(); i++) {
    int l = LevelSize(toplevel_size, int(i), tile_rounding_mode);
    if (l < 0) {
      return false;
    }
    TINYEXR_CHECK_AND_RETURN_C(l <= std::numeric_limits<int>::max() - size + 1, false);

    numTiles[i] = (l + size - 1) / size;
  }
  return true;
}